

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  int iVar6;
  ImGuiViewportP *in_RSI;
  ImGuiWindow *pIVar7;
  ImVec2 IVar8;
  
  pIVar4 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if ((1 < (GImGui->CurrentWindowStack).Size) ||
     (GImGui->WithinFrameScopeWithImplicitWindow == false)) {
    if ((pIVar7->DC).CurrentColumns != (ImGuiColumns *)0x0) {
      EndColumns();
    }
    uVar5 = pIVar7->Flags;
    if ((uVar5 >> 0x1d & 1) == 0) {
      PopClipRect();
      uVar5 = pIVar7->Flags;
    }
    if ((uVar5 >> 0x18 & 1) == 0) {
      LogFinish();
    }
    if (((pIVar7->DockNode != (ImGuiDockNode *)0x0) && ((pIVar7->field_0x43a & 2) != 0)) &&
       (pIVar3 = pIVar7->DockNode->HostWindow, pIVar3 != (ImGuiWindow *)0x0)) {
      IVar1 = (pIVar7->DC).CursorMaxPos;
      IVar8.x = (IVar1.x + (pIVar7->WindowPadding).x) - (pIVar3->WindowPadding).x;
      IVar8.y = (IVar1.y + (pIVar7->WindowPadding).y) - (pIVar3->WindowPadding).y;
      (pIVar3->DC).CursorMaxPos = IVar8;
    }
    iVar2 = (pIVar4->CurrentWindowStack).Size;
    iVar6 = iVar2 + -1;
    (pIVar4->CurrentWindowStack).Size = iVar6;
    if ((pIVar7->Flags & 0x4000000) != 0) {
      (pIVar4->BeginPopupStack).Size = (pIVar4->BeginPopupStack).Size + -1;
    }
    if (iVar6 == 0) {
      pIVar7 = (ImGuiWindow *)0x0;
    }
    else {
      pIVar7 = (pIVar4->CurrentWindowStack).Data[(long)iVar2 + -2];
    }
    SetCurrentWindow(pIVar7);
    if (pIVar4->CurrentWindow != (ImGuiWindow *)0x0) {
      SetCurrentViewport((ImGuiWindow *)pIVar4->CurrentWindow->Viewport,in_RSI);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}